

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

size_t __thiscall cmMakefile::GetRecursionDepthLimit(cmMakefile *this)

{
  bool bVar1;
  char *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_00;
  string *local_b8;
  unsigned_long depthUL_1;
  string local_a8;
  undefined1 local_88 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  depthEnv;
  unsigned_long depthUL;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue depthStr;
  size_t depth;
  cmMakefile *this_local;
  
  depthStr.Value = (string *)0x3e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_41);
  local_20 = GetDefinition(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    str = cmValue::GetCStr(&local_20);
    bVar1 = cmStrToULong(str,(unsigned_long *)
                             &depthEnv.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
    if (bVar1) {
      depthStr.Value =
           (string *)
           depthEnv.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._32_8_;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CMAKE_MAXIMUM_RECURSION_DEPTH",
               (allocator<char> *)((long)&depthUL_1 + 7));
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&depthUL_1 + 7));
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_88);
    if (bVar1) {
      str_00 = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_88);
      bVar1 = cmStrToULong(str_00,(unsigned_long *)&local_b8);
      if (bVar1) {
        depthStr.Value = local_b8;
      }
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_88);
  }
  return (size_t)depthStr.Value;
}

Assistant:

size_t cmMakefile::GetRecursionDepthLimit() const
{
  size_t depth = CMake_DEFAULT_RECURSION_LIMIT;
  if (cmValue depthStr =
        this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH")) {
    unsigned long depthUL;
    if (cmStrToULong(depthStr.GetCStr(), &depthUL)) {
      depth = depthUL;
    }
  } else if (cm::optional<std::string> depthEnv =
               cmSystemTools::GetEnvVar("CMAKE_MAXIMUM_RECURSION_DEPTH")) {
    unsigned long depthUL;
    if (cmStrToULong(*depthEnv, &depthUL)) {
      depth = depthUL;
    }
  }
  return depth;
}